

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

uint __thiscall RtApi::formatBytes(RtApi *this,RtAudioFormat format)

{
  uint uVar1;
  
  switch(format) {
  case 1:
    uVar1 = 1;
    break;
  case 2:
    uVar1 = 2;
    break;
  case 4:
  case 8:
switchD_0010aeb1_caseD_4:
    uVar1 = 4;
    break;
  default:
    if (format == 0x10) goto switchD_0010aeb1_caseD_4;
    if (format == 0x20) {
      return 8;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    uVar1 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->errorText_,0,(char *)(this->errorText_)._M_string_length,0x116870);
    error(this,RTAUDIO_WARNING);
  }
  return uVar1;
}

Assistant:

unsigned int RtApi :: formatBytes( RtAudioFormat format )
{
  if ( format == RTAUDIO_SINT16 )
    return 2;
  else if ( format == RTAUDIO_SINT32 || format == RTAUDIO_FLOAT32 || format == RTAUDIO_SINT24)
    return 4;
  else if ( format == RTAUDIO_FLOAT64 )
    return 8;
  else if ( format == RTAUDIO_SINT8 )
    return 1;

  errorText_ = "RtApi::formatBytes: undefined format.";
  error( RTAUDIO_WARNING );

  return 0;
}